

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_tests.cpp
# Opt level: O1

void __thiscall
compress_tests::compress_script_to_compressed_pubkey_id::test_method
          (compress_script_to_compressed_pubkey_id *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  size_type local_1bc;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  assertion_result local_198;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  bool done;
  size_type local_154;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  CKey key;
  size_type *local_120;
  undefined1 local_118 [16];
  pointer local_108;
  size_type **local_100;
  bool *local_f8;
  size_type **local_f0;
  char *local_e8;
  assertion_result local_e0;
  CompressedScript out;
  CScript script;
  undefined1 local_58 [24];
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81(&key,0));
  local_58._16_8_ = 0;
  uStack_40 = (bool **)0x0;
  local_58._0_8_ = (char *)0x0;
  local_58._8_8_ = 0;
  CKey::GetPubKey((CPubKey *)&out,&key);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118,(CPubKey *)&out);
  this_00 = &CScript::operator<<((CScript *)local_58,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118)
             ->super_CScriptBase;
  uVar2 = this_00->_size;
  uVar3 = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    uVar3 = uVar2;
  }
  ppVar5 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this_00->_union).indirect_contents.indirect;
  if (uVar2 < 0x1d) {
    ppVar5 = this_00;
  }
  local_198.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_00,(uchar *)((long)&ppVar5->_union + (long)(int)uVar3),(uchar *)&local_198);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&script.super_CScriptBase,this_00);
  if ((_func_int **)local_118._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_118._0_8_,(long)local_108 - local_118._0_8_);
  }
  if (0x1c < uStack_40._4_4_) {
    free((void *)local_58._0_8_);
    local_58._0_8_ = (char *)0x0;
  }
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x6b;
  file.m_begin = (iterator)&local_140;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_150,msg);
  local_118[8] = false;
  local_118._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  sVar4 = script.super_CScriptBase._size - 0x1d;
  if (script.super_CScriptBase._size < 0x1d) {
    sVar4 = script.super_CScriptBase._size;
  }
  local_100 = (size_type **)0xf98c4c;
  local_f0 = &local_120;
  local_120 = (size_type *)CONCAT44(local_120._4_4_,sVar4);
  local_198.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar4 == 0x23);
  local_f8 = (bool *)&local_154;
  local_154 = 0x23;
  local_198.m_message.px = (element_type *)0x0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_e0.m_message.px = (element_type *)0xe9a972;
  out._union._24_8_ = &local_f0;
  out._union._8_8_ = out._union._8_8_ & 0xffffffffffffff00;
  out._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3d30;
  out._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  uStack_40 = &local_f8;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_198,(lazy_ostream *)local_118,1,2,REQUIRE,0xe9aa89,(size_t)&local_e0,0x6b,&out,
             "35U",local_58);
  boost::detail::shared_count::~shared_count(&local_198.m_message.pn);
  out._union._16_8_ = 0;
  out._union._24_8_ = 0;
  out._union.indirect_contents.indirect = (char *)0x0;
  out._union._8_8_ = 0;
  out._union.direct[0x20] = '\0';
  out._size = 0;
  done = CompressScript(&script,&out);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x6f;
  file_00.m_begin = (iterator)&local_168;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
             msg_00);
  local_198.m_message.px = (element_type *)((ulong)local_198.m_message.px & 0xffffffffffffff00);
  local_198._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_154 = CONCAT31(local_154._1_3_,1);
  local_f8 = &done;
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)done;
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0 = (size_type **)0xe9a912;
  local_e8 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d4010;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  uStack_40 = &local_f8;
  local_120 = &local_154;
  local_118[8] = false;
  local_118._0_8_ = &PTR__lazy_ostream_013d4010;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,(lazy_ostream *)&local_198,1,2,REQUIRE,0xfeb143,(size_t)&local_f0,0x6f,
             local_58,"true",local_118);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x72;
  file_01.m_begin = (iterator)&local_1a8;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1b8,
             msg_01);
  local_198.m_message.px = (element_type *)((ulong)local_198.m_message.px & 0xffffffffffffff00);
  local_198._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_154 = out._size - 0x22;
  if (out._size < 0x22) {
    local_154 = out._size;
  }
  local_180 = "";
  local_120 = &local_1bc;
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_154 == 0x21);
  local_1bc = 0x21;
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0 = (size_type **)0xe9a912;
  local_e8 = "";
  local_f8 = (bool *)&local_154;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  uStack_40 = &local_f8;
  local_118[8] = false;
  local_118._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,(lazy_ostream *)&local_198,1,2,REQUIRE,0xfadf88,(size_t)&local_f0,0x72,
             local_58,"33U",local_118);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x73;
  file_02.m_begin = (iterator)&local_1d0;
  msg_02.m_end = pvVar9;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1e0,
             msg_02);
  local_198.m_message.px = (element_type *)((ulong)local_198.m_message.px & 0xffffffffffffff00);
  local_198._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  uVar7 = &out;
  if (0x21 < out._size) {
    uVar7 = out._union.indirect_contents.indirect;
  }
  uVar6 = &script;
  if (0x1c < script.super_CScriptBase._size) {
    uVar6 = script.super_CScriptBase._union.indirect_contents.indirect;
  }
  bVar1 = (((CScript *)uVar6)->super_CScriptBase)._union.direct[1];
  local_154 = (uint)(byte)(((CompressedScript *)uVar7)->_union).direct[0] - (uint)bVar1;
  local_1bc = 0;
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((((CompressedScript *)uVar7)->_union).direct[0] == bVar1);
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0 = (size_type **)0xe9a912;
  local_e8 = "";
  local_f8 = (bool *)&local_154;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  uStack_40 = &local_f8;
  local_120 = &local_1bc;
  local_118[8] = false;
  local_118._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,(lazy_ostream *)&local_198,1,2,REQUIRE,0xe9ab4a,(size_t)&local_f0,0x73,
             local_58,"0",local_118);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x74;
  file_03.m_begin = (iterator)&local_1f0;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_200,
             msg_03);
  local_198.m_message.px = (element_type *)((ulong)local_198.m_message.px & 0xffffffffffffff00);
  local_198._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_198.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  uVar7 = out._union.indirect_contents.indirect;
  if (out._size < 0x22) {
    uVar7 = &out;
  }
  uVar6 = script.super_CScriptBase._union.indirect_contents.indirect;
  if (script.super_CScriptBase._size < 0x1d) {
    uVar6 = &script;
  }
  local_154 = memcmp((void *)((long)&((CompressedScript *)uVar7)->_union + 1),
                     (void *)((long)&(((CScript *)uVar6)->super_CScriptBase)._union + 2),0x20);
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_154 == 0);
  local_1bc = 0;
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0 = (size_type **)0xe9a912;
  local_e8 = "";
  local_f8 = (bool *)&local_154;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
  uStack_40 = &local_f8;
  local_120 = &local_1bc;
  local_118[8] = false;
  local_118._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,(lazy_ostream *)&local_198,1,2,REQUIRE,0xe9ab73,(size_t)&local_f0,0x74,
             local_58,"0",local_118);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  if (0x21 < out._size) {
    free(out._union.indirect_contents.indirect);
    out._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < script.super_CScriptBase._size) {
    free(script.super_CScriptBase._union.indirect_contents.indirect);
    script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if ((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )key.keydata._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&key.keydata,
               (array<unsigned_char,_32UL> *)
               key.keydata._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(compress_script_to_compressed_pubkey_id)
{
    CKey key = GenerateRandomKey(); // case compressed PubKeyID

    CScript script = CScript() << ToByteVector(key.GetPubKey()) << OP_CHECKSIG; // COMPRESSED_PUBLIC_KEY_SIZE (33)
    BOOST_CHECK_EQUAL(script.size(), 35U);

    CompressedScript out;
    bool done = CompressScript(script, out);
    BOOST_CHECK_EQUAL(done, true);

    // Check compressed script
    BOOST_CHECK_EQUAL(out.size(), 33U);
    BOOST_CHECK_EQUAL(memcmp(out.data(), script.data() + 1, 1), 0);
    BOOST_CHECK_EQUAL(memcmp(out.data() + 1, script.data() + 2, 32), 0); // compare the 32 chars of the compressed CPubKey
}